

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu5xx_common.c
# Opt level: O0

VepuRgb2YuvCfg * get_rgb2yuv_cfg(MppFrameColorRange range,MppFrameColorSpace color)

{
  uint local_28;
  RK_U32 i;
  RK_U32 size;
  VepuRgb2YuvCfg *cfg;
  MppFrameColorSpace color_local;
  MppFrameColorRange range_local;
  
  if (range == MPP_FRAME_RANGE_JPEG) {
    _i = vepu_rgb2full_yuv_cfg_set;
  }
  else {
    _i = vepu_rgb2limit_yuv_cfg_set;
  }
  local_28 = 0;
  while( true ) {
    if (1 < local_28) {
      return _i;
    }
    if (_i[local_28].color == color) break;
    local_28 = local_28 + 1;
  }
  return _i + local_28;
}

Assistant:

const VepuRgb2YuvCfg *get_rgb2yuv_cfg(MppFrameColorRange range, MppFrameColorSpace color)
{
    const VepuRgb2YuvCfg *cfg;
    RK_U32 size;
    RK_U32 i;

    /* only jpeg full range, others limit range */
    if (range == MPP_FRAME_RANGE_JPEG) {
        /* set default cfg BT.601 */
        cfg = &vepu_rgb2full_yuv_cfg_set[0];
        size = MPP_ARRAY_ELEMS(vepu_rgb2full_yuv_cfg_set);
    } else {
        /* set default cfg BT.601 */
        cfg = &vepu_rgb2limit_yuv_cfg_set[0];
        size = MPP_ARRAY_ELEMS(vepu_rgb2limit_yuv_cfg_set);
    }

    for (i = 0; i < size; i++)
        if (cfg[i].color == color)
            return &cfg[i];

    return cfg;
}